

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.c
# Opt level: O0

feed_db_status_t import_csv_file_db(char *path,char *table,feed_db_t *db)

{
  int iVar1;
  char *pcVar2;
  int local_78;
  int local_74;
  int j;
  int i;
  sqlite3_stmt *stmt;
  char *insert_query;
  char *error_msg;
  char *create_query;
  char **ppcStack_48;
  int field_count;
  char **field_names;
  int record_count;
  int lines_count;
  char **record_values;
  FILE *fp;
  feed_db_t *db_local;
  char *table_local;
  char *path_local;
  
  fp = (FILE *)db;
  db_local = (feed_db_t *)table;
  table_local = path;
  record_values = (char **)fopen(path,"r");
  if ((FILE *)record_values == (FILE *)0x0) {
    pcVar2 = strdup("Failed to open .csv file");
    fp->_IO_read_end = pcVar2;
    path_local._4_4_ = FEED_DB_ERROR;
  }
  else {
    _record_count = (char **)0x0;
    iVar1 = count_lines((FILE *)record_values);
    field_names._4_4_ = iVar1 + -1;
    field_names._0_4_ = 0;
    if (field_names._4_4_ < 0) {
      free(_record_count);
      fclose((FILE *)record_values);
      pcVar2 = strdup("Failed to count lines in CSV file");
      fp->_IO_read_end = pcVar2;
      path_local._4_4_ = FEED_DB_ERROR;
    }
    else {
      ppcStack_48 = (char **)0x0;
      create_query._4_4_ = read_header((FILE *)record_values,&stack0xffffffffffffffb8);
      if (create_query._4_4_ < 0) {
        free_cstr_arr(ppcStack_48,(long)create_query._4_4_);
        free(_record_count);
        fclose((FILE *)record_values);
        pcVar2 = strdup("Failed to read CSV file header");
        fp->_IO_read_end = pcVar2;
        path_local._4_4_ = FEED_DB_ERROR;
      }
      else {
        bake_create_uni_query_db((char *)db_local,create_query._4_4_,ppcStack_48,&error_msg);
        iVar1 = sqlite3_exec((sqlite3 *)fp->_IO_read_ptr,error_msg,(sqlite3_callback)0x0,(void *)0x0
                             ,&insert_query);
        *(int *)&fp->_IO_read_base = iVar1;
        free(error_msg);
        free_cstr_arr(ppcStack_48,(long)create_query._4_4_);
        if (*(int *)&fp->_IO_read_base == 0) {
          bake_insert_uni_query_db((char *)db_local,create_query._4_4_,(char **)&stmt);
          sqlite3_prepare_v2((sqlite3 *)fp->_IO_read_ptr,(char *)stmt,-1,(sqlite3_stmt **)&j,
                             (char **)0x0);
          for (local_74 = 0; local_74 < field_names._4_4_; local_74 = local_74 + 1) {
            iVar1 = read_record((FILE *)record_values,create_query._4_4_,(char ***)&record_count);
            if (0 < iVar1) {
              for (local_78 = 0; local_78 < create_query._4_4_; local_78 = local_78 + 1) {
                sqlite3_bind_text(_j,local_78 + 1,_record_count[local_78],-1,
                                  (_func_void_void_ptr *)0x0);
              }
              iVar1 = sqlite3_step(_j);
              *(int *)&fp->_IO_read_base = iVar1;
              if (*(int *)&fp->_IO_read_base != 0x65) {
                fclose((FILE *)record_values);
                free(stmt);
                free_cstr_arr(_record_count,(long)create_query._4_4_);
                pcVar2 = sqlite3_errmsg((sqlite3 *)fp->_IO_read_ptr);
                pcVar2 = strdup(pcVar2);
                fp->_IO_read_end = pcVar2;
                sqlite3_finalize(_j);
                return FEED_DB_ERROR;
              }
              sqlite3_clear_bindings(_j);
              sqlite3_reset(_j);
              field_names._0_4_ = (int)field_names + 1;
            }
            free_cstr_arr(_record_count,(long)create_query._4_4_);
          }
          sqlite3_finalize(_j);
          free(stmt);
          fclose((FILE *)record_values);
          path_local._4_4_ = FEED_DB_SUCCESS;
        }
        else {
          if (insert_query == (char *)0x0) {
            pcVar2 = strdup("Failed to create a table");
            fp->_IO_read_end = pcVar2;
          }
          else {
            pcVar2 = strdup(insert_query);
            fp->_IO_read_end = pcVar2;
            sqlite3_free(insert_query);
          }
          fclose((FILE *)record_values);
          free(_record_count);
          path_local._4_4_ = FEED_DB_ERROR;
        }
      }
    }
  }
  return path_local._4_4_;
}

Assistant:

feed_db_status_t import_csv_file_db(const char *path, const char *table, feed_db_t *db) {
    FILE *fp = fopen(path, "r");

    if (!fp) {
        db->error_msg = strdup("Failed to open .csv file");
        return FEED_DB_ERROR;
    }

    char **record_values = NULL;
    int lines_count = count_lines(fp) - 1;
    int record_count = 0;

    if (lines_count < 0) {
        free(record_values);
        fclose(fp);

        db->error_msg = strdup("Failed to count lines in CSV file");
        return FEED_DB_ERROR;
    }

    char **field_names = NULL;
    int field_count = read_header(fp, &field_names);

    if (field_count < 0) {
        free_cstr_arr(field_names, field_count);
        free(record_values);
        fclose(fp);

        db->error_msg = strdup("Failed to read CSV file header");
        return FEED_DB_ERROR;
    }

    // begin_transaction_db(db);

    char *create_query;
    bake_create_uni_query_db(table, field_count, field_names, &create_query);

    char *error_msg;
    db->rc = sqlite3_exec(db->conn, create_query, NULL, NULL, &error_msg);

    free(create_query);
    free_cstr_arr(field_names, field_count);

    if (db->rc) {
        if (error_msg != NULL) {
            db->error_msg = strdup(error_msg);
            sqlite3_free(error_msg);
        } else {
            db->error_msg = strdup("Failed to create a table");
        }
        fclose(fp);
        free(record_values);
        return FEED_DB_ERROR;
    }

    char *insert_query;
    bake_insert_uni_query_db(table, field_count, &insert_query);

    sqlite3_stmt *stmt;
    sqlite3_prepare_v2(db->conn, insert_query, -1, &stmt, NULL);

    for (int i = 0; i < lines_count; i++) {
        if (read_record(fp, field_count, &record_values) > 0) {
            for (int j = 0; j < field_count; j++)
                sqlite3_bind_text(stmt, j + 1, record_values[j], -1, SQLITE_STATIC);

            db->rc = sqlite3_step(stmt);
            if (db->rc != SQLITE_DONE) {
                fclose(fp);
                free(insert_query);
                free_cstr_arr(record_values, field_count);
                db->error_msg = strdup(sqlite3_errmsg(db->conn));
                sqlite3_finalize(stmt);
                return FEED_DB_ERROR;
            }

            sqlite3_clear_bindings(stmt);
            sqlite3_reset(stmt);
            record_count++;
        }
        free_cstr_arr(record_values, field_count);
    }

    sqlite3_finalize(stmt);

    // end_transaction_db(db);

    free(insert_query);
    fclose(fp);

    return FEED_DB_SUCCESS;
}